

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void __thiscall Fl_Window_Type::draw_overlay(Fl_Window_Type *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Fl_Align FVar4;
  int iVar5;
  int local_134;
  int local_12c;
  int local_118;
  Fl_Fontsize local_f0;
  int local_ec;
  int hh_1;
  int ww_1;
  int qt;
  int qy;
  int qr;
  int qx;
  Fl_Widget_Type *qw;
  Fl_Type *q_2;
  int ih;
  int iw;
  int h;
  int w;
  int t_1;
  int r_2;
  int y_2;
  int x_2;
  Fl_Widget_Type *mysel;
  int local_98;
  int mybt_bak;
  int mybr_bak;
  int myby_bak;
  int mybx_bak;
  int ysp;
  int xsp;
  int d;
  int hh;
  int ww;
  int t;
  int r_1;
  int y_1;
  int x_1;
  Fl_Widget_Type *myo_1;
  Fl_Type *q_1;
  Fl_Type *selection;
  int myst;
  int mysr;
  int mysy;
  int mysx;
  int mybt;
  int mybr;
  int myby;
  int mybx;
  int b;
  int y;
  int r;
  int x;
  Fl_Widget_Type *myo;
  Fl_Type *q;
  Fl_Window_Type *this_local;
  
  q = (Fl_Type *)this;
  if (this->recalc != 0) {
    iVar2 = Fl_Widget::w((this->super_Fl_Widget_Type).o);
    this->bx = iVar2;
    iVar2 = Fl_Widget::h((this->super_Fl_Widget_Type).o);
    this->by = iVar2;
    this->br = 0;
    this->bt = 0;
    this->numselected = 0;
    myo = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
    while( true ) {
      bVar1 = false;
      if (myo != (Fl_Widget_Type *)0x0) {
        bVar1 = (this->super_Fl_Widget_Type).super_Fl_Type.level < (myo->super_Fl_Type).level;
      }
      if (!bVar1) break;
      if ((((myo->super_Fl_Type).selected != '\0') &&
          (iVar2 = (*(myo->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) &&
         (iVar2 = (*(myo->super_Fl_Type)._vptr_Fl_Type[0x1e])(), iVar2 == 0)) {
        this->numselected = this->numselected + 1;
        _r = myo;
        iVar2 = Fl_Widget::x(myo->o);
        if (iVar2 < this->bx) {
          iVar2 = Fl_Widget::x(_r->o);
          this->bx = iVar2;
        }
        iVar2 = Fl_Widget::y(_r->o);
        if (iVar2 < this->by) {
          iVar2 = Fl_Widget::y(_r->o);
          this->by = iVar2;
        }
        iVar2 = Fl_Widget::x(_r->o);
        iVar3 = Fl_Widget::w(_r->o);
        if (this->br < iVar2 + iVar3) {
          iVar2 = Fl_Widget::x(_r->o);
          iVar3 = Fl_Widget::w(_r->o);
          this->br = iVar2 + iVar3;
        }
        iVar2 = Fl_Widget::y(_r->o);
        iVar3 = Fl_Widget::h(_r->o);
        if (this->bt < iVar2 + iVar3) {
          iVar2 = Fl_Widget::y(_r->o);
          iVar3 = Fl_Widget::h(_r->o);
          this->bt = iVar2 + iVar3;
        }
      }
      myo = (Fl_Widget_Type *)(myo->super_Fl_Type).next;
    }
    this->recalc = 0;
    this->sx = this->bx;
    this->sy = this->by;
    this->sr = this->br;
    this->st = this->bt;
  }
  fl_color(0x58);
  if ((this->drag == 0x20) && ((this->x1 != this->mx || (this->y1 != this->my)))) {
    y = this->x1;
    b = this->mx;
    if (b < y) {
      y = this->mx;
      b = this->x1;
    }
    mybx = this->y1;
    myby = this->my;
    if (myby < mybx) {
      mybx = this->my;
      myby = this->y1;
    }
    fl_rect(y,mybx,b - y,myby - mybx);
  }
  if ((overlays_invisible == 0) || (this->drag != 0)) {
    if ((this->super_Fl_Widget_Type).super_Fl_Type.selected != '\0') {
      iVar2 = Fl_Widget::w((this->super_Fl_Widget_Type).o);
      iVar3 = Fl_Widget::h((this->super_Fl_Widget_Type).o);
      fl_rect(0,0,iVar2,iVar3);
    }
    if (this->numselected != 0) {
      mysr = Fl_Widget::w((this->super_Fl_Widget_Type).o);
      mybr = mysr;
      myst = Fl_Widget::h((this->super_Fl_Widget_Type).o);
      selection._4_4_ = 0;
      mysx = 0;
      selection._0_4_ = 0;
      mysy = 0;
      q_1 = (Fl_Type *)0x0;
      myo_1 = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
      mybt = myst;
      while( true ) {
        bVar1 = false;
        if (myo_1 != (Fl_Widget_Type *)0x0) {
          bVar1 = (this->super_Fl_Widget_Type).super_Fl_Type.level < (myo_1->super_Fl_Type).level;
        }
        if (!bVar1) break;
        if ((((myo_1->super_Fl_Type).selected != '\0') &&
            (iVar2 = (*(myo_1->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) &&
           (iVar2 = (*(myo_1->super_Fl_Type)._vptr_Fl_Type[0x1e])(), iVar2 == 0)) {
          q_1 = &myo_1->super_Fl_Type;
          _y_1 = myo_1;
          newposition(this,myo_1,&r_1,&t,&ww,&hh);
          if (((show_guides == 0) || (this->drag == 0)) || (this->numselected != 1)) {
            fl_rect(r_1,t,ww - r_1,hh - t);
          }
          if (r_1 < mysr) {
            mysr = r_1;
          }
          if (t < myst) {
            myst = t;
          }
          if (selection._4_4_ < ww) {
            selection._4_4_ = ww;
          }
          if ((int)selection < hh) {
            selection._0_4_ = hh;
          }
          FVar4 = Fl_Widget::align(_y_1->o);
          if ((FVar4 & 0x10) == 0) {
            FVar4 = Fl_Widget::align(_y_1->o);
            if ((FVar4 & 0x80) == 0) {
              local_118 = 0;
            }
            else {
              local_118 = Fl_Widget::w(_y_1->o);
            }
            d = local_118;
            xsp = Fl_Widget::labelsize(_y_1->o);
            Fl_Widget::measure_label(_y_1->o,&d,&xsp);
            FVar4 = Fl_Widget::align(_y_1->o);
            if ((FVar4 & 1) == 0) {
              FVar4 = Fl_Widget::align(_y_1->o);
              if ((FVar4 & 2) == 0) {
                FVar4 = Fl_Widget::align(_y_1->o);
                if ((FVar4 & 4) == 0) {
                  FVar4 = Fl_Widget::align(_y_1->o);
                  if ((FVar4 & 8) != 0) {
                    ww = d + 4 + ww;
                  }
                }
                else {
                  r_1 = r_1 - (d + 4);
                }
              }
              else {
                hh = xsp + hh;
              }
            }
            else {
              t = t - xsp;
            }
          }
          if (r_1 < mybr) {
            mybr = r_1;
          }
          if (t < mybt) {
            mybt = t;
          }
          if (mysx < ww) {
            mysx = ww;
          }
          if (mysy < hh) {
            mysy = hh;
          }
        }
        myo_1 = (Fl_Widget_Type *)(myo_1->super_Fl_Type).next;
      }
      if ((this->super_Fl_Widget_Type).super_Fl_Type.selected == '\0') {
        if ((show_guides != 0) && (this->drag != 0)) {
          mybr_bak = mybr;
          mybt_bak = mybt;
          local_98 = mysx;
          mysel._4_4_ = mysy;
          _y_2 = (Fl_Widget_Type *)q_1;
          (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x2e])
                    (this,&mybx_bak,&myby_bak);
          if (this->drag != 0) {
            ysp = mybt - myby_bak;
            iVar2 = ysp;
            if (ysp < 1) {
              iVar2 = -ysp;
            }
            if (iVar2 < 3) {
              this->dy = this->dy - ysp;
              if ((this->drag & 0x10U) != 0) {
                mysy = mysy - ysp;
              }
              mybt = mybt - ysp;
              draw_v_arrow(mybr + 5,mybt,0);
            }
            iVar2 = Fl_Widget::h((this->super_Fl_Widget_Type).o);
            ysp = (iVar2 - mysy) - myby_bak;
            iVar2 = ysp;
            if (ysp < 1) {
              iVar2 = -ysp;
            }
            if (iVar2 < 3) {
              this->dy = ysp + this->dy;
              if ((this->drag & 0x10U) != 0) {
                mybt = ysp + mybt;
              }
              iVar3 = ysp + mysy;
              iVar5 = mybr + 5;
              mysy = iVar3;
              iVar2 = Fl_Widget::h((this->super_Fl_Widget_Type).o);
              draw_v_arrow(iVar5,iVar3,iVar2);
            }
            ysp = mybr - mybx_bak;
            iVar2 = ysp;
            if (ysp < 1) {
              iVar2 = -ysp;
            }
            if (iVar2 < 3) {
              this->dx = this->dx - ysp;
              if ((this->drag & 0x10U) != 0) {
                mysx = mysx - ysp;
              }
              mybr = mybr - ysp;
              draw_h_arrow(mybr,mybt + 5,0);
            }
            iVar2 = Fl_Widget::w((this->super_Fl_Widget_Type).o);
            ysp = (iVar2 - mysx) - mybx_bak;
            iVar2 = ysp;
            if (ysp < 1) {
              iVar2 = -ysp;
            }
            if (iVar2 < 3) {
              this->dx = ysp + this->dx;
              if ((this->drag & 0x10U) != 0) {
                mybr = ysp + mybr;
              }
              iVar3 = ysp + mysx;
              iVar5 = mybt + 5;
              mysx = iVar3;
              iVar2 = Fl_Widget::w((this->super_Fl_Widget_Type).o);
              draw_h_arrow(iVar3,iVar5,iVar2);
            }
          }
          if (((this->numselected == 1) && (q_1 != (Fl_Type *)0x0)) && ((this->drag & 0x10U) == 0))
          {
            newposition(this,_y_2,&r_2,&t_1,&w,&h);
            q_2._4_4_ = w - r_2;
            q_2._0_4_ = h - t_1;
            ih = (int)q_2;
            iw = q_2._4_4_;
            (*(_y_2->super_Fl_Type)._vptr_Fl_Type[0x2d])(_y_2,(long)&q_2 + 4,&q_2);
            if ((this->drag & 0xcU) != 0) {
              ysp = (int)q_2 - ih;
              iVar2 = ysp;
              if (ysp < 1) {
                iVar2 = -ysp;
              }
              if (iVar2 < 5) {
                if ((this->drag & 8U) == 0) {
                  mysy = ysp + mysy;
                  h = ysp + h;
                  this->dy = ysp + this->dy;
                }
                else {
                  mybt = mybt - ysp;
                  t_1 = t_1 - ysp;
                  this->dy = this->dy - ysp;
                }
              }
              if (r_2 < 0x32) {
                local_12c = r_2 + 10;
              }
              else {
                local_12c = r_2 + -10;
              }
              FVar4 = 4;
              if (r_2 < 0x32) {
                FVar4 = 8;
              }
              draw_height(local_12c,t_1,h,FVar4);
            }
            if ((this->drag & 3U) != 0) {
              ysp = q_2._4_4_ - iw;
              iVar2 = ysp;
              if (ysp < 1) {
                iVar2 = -ysp;
              }
              if (iVar2 < 5) {
                if ((this->drag & 1U) == 0) {
                  mysx = ysp + mysx;
                  w = ysp + w;
                  this->dx = ysp + this->dx;
                }
                else {
                  mybr = mybr - ysp;
                  r_2 = r_2 - ysp;
                  this->dx = this->dx - ysp;
                }
              }
              if (t_1 < 0x32) {
                local_134 = t_1 + 10;
              }
              else {
                local_134 = t_1 + -10;
              }
              FVar4 = 1;
              if (t_1 < 0x32) {
                FVar4 = 2;
              }
              draw_width(r_2,local_134,w,FVar4);
            }
          }
          if ((this->drag != 0) && (iVar2 = (*q_1->_vptr_Fl_Type[0x17])(), iVar2 != 0)) {
            qw = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
            while( true ) {
              bVar1 = false;
              if (qw != (Fl_Widget_Type *)0x0) {
                bVar1 = (this->super_Fl_Widget_Type).super_Fl_Type.level < (qw->super_Fl_Type).level
                ;
              }
              if (!bVar1) break;
              if ((qw != (Fl_Widget_Type *)q_1) &&
                 (iVar2 = (*(qw->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
                _qr = qw;
                iVar2 = Fl_Widget::visible_r(qw->o);
                if (iVar2 != 0) {
                  qy = Fl_Widget::x(_qr->o);
                  iVar2 = Fl_Widget::x(_qr->o);
                  iVar3 = Fl_Widget::w(_qr->o);
                  qt = iVar2 + iVar3;
                  ww_1 = Fl_Widget::y(_qr->o);
                  iVar2 = Fl_Widget::y(_qr->o);
                  iVar3 = Fl_Widget::h(_qr->o);
                  hh_1 = iVar2 + iVar3;
                  FVar4 = Fl_Widget::align(_qr->o);
                  if ((FVar4 & 0x10) == 0) {
                    local_ec = Fl_Widget::w(_qr->o);
                    local_f0 = Fl_Widget::labelsize(_qr->o);
                    Fl_Widget::measure_label(_qr->o,&local_ec,&local_f0);
                    FVar4 = Fl_Widget::align(_qr->o);
                    if ((FVar4 & 1) != 0) {
                      ww_1 = ww_1 - local_f0;
                    }
                    FVar4 = Fl_Widget::align(_qr->o);
                    if ((FVar4 & 2) != 0) {
                      hh_1 = local_f0 + hh_1;
                    }
                  }
                  iVar2 = ww_1;
                  iVar5 = Fl_Widget::y(_y_2->o);
                  iVar3 = Fl_Widget::h(_y_2->o);
                  iVar3 = (iVar2 - iVar5) - iVar3;
                  if (iVar3 < 1) {
                    iVar3 = -iVar3;
                  }
                  iVar2 = Fl_Widget::y(_y_2->o);
                  iVar2 = iVar2 - hh_1;
                  if (iVar2 < 1) {
                    iVar2 = -iVar2;
                  }
                  iVar2 = fl_min(iVar3,iVar2);
                  if (iVar2 < 0x19) {
                    if ((this->drag & 0x11U) != 0) {
                      ysp = mybr - qy;
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (iVar2 < 3) {
                        this->dx = ysp + this->dx;
                        mybr = ysp + mybr;
                        if ((this->drag & 0x10U) != 0) {
                          mysx = ysp + mysx;
                        }
                        draw_left_brace(_qr->o);
                      }
                    }
                    if ((this->drag & 0x12U) != 0) {
                      ysp = qt - mysx;
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (iVar2 < 3) {
                        this->dx = ysp + this->dx;
                        if ((this->drag & 0x10U) != 0) {
                          mybr = ysp + mybr;
                        }
                        mysx = ysp + mysx;
                        draw_right_brace(_qr->o);
                      }
                    }
                  }
                  if ((this->drag & 0x18U) != 0) {
                    ysp = mybt - ww_1;
                    iVar2 = ysp;
                    if (ysp < 1) {
                      iVar2 = -ysp;
                    }
                    if (iVar2 < 3) {
                      this->dy = ysp + this->dy;
                      mybt = ysp + mybt;
                      if ((this->drag & 0x10U) != 0) {
                        mysy = ysp + mysy;
                      }
                      draw_top_brace(_qr->o);
                    }
                  }
                  if ((this->drag & 0x14U) != 0) {
                    ysp = hh_1 - mysy;
                    iVar2 = ysp;
                    if (ysp < 1) {
                      iVar2 = -ysp;
                    }
                    if (iVar2 < 3) {
                      this->dy = ysp + this->dy;
                      if ((this->drag & 0x10U) != 0) {
                        mybt = ysp + mybt;
                      }
                      mysy = ysp + mysy;
                      draw_bottom_brace(_qr->o);
                    }
                  }
                  iVar2 = (*(_y_2->super_Fl_Type)._vptr_Fl_Type[0x20])();
                  if (iVar2 == 0) {
                    (*(_qr->super_Fl_Type)._vptr_Fl_Type[0x2e])(_qr,&mybx_bak,&myby_bak);
                  }
                  else {
                    (*(_y_2->super_Fl_Type)._vptr_Fl_Type[0x2e])(_y_2,&mybx_bak,&myby_bak);
                  }
                  if ((mybt <= hh_1) && (ww_1 <= mysy)) {
                    if ((this->drag & 0x11U) != 0) {
                      ysp = (qy - mybr) - mybx_bak;
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (2 < iVar2) {
                        ysp = (qy - mybr) + mybx_bak;
                      }
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (iVar2 < 3) {
                        this->dx = ysp + this->dx;
                        mybr = ysp + mybr;
                        if ((this->drag & 0x10U) != 0) {
                          mysx = ysp + mysx;
                        }
                        draw_h_arrow(mybr,(mybt + mysy) / 2,qy);
                      }
                      ysp = (qt - mybr) - mybx_bak;
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (2 < iVar2) {
                        ysp = (qt - mybr) + mybx_bak;
                      }
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (iVar2 < 3) {
                        this->dx = ysp + this->dx;
                        mybr = ysp + mybr;
                        if ((this->drag & 0x10U) != 0) {
                          mysx = ysp + mysx;
                        }
                        draw_h_arrow(mybr,(mybt + mysy) / 2,qt);
                      }
                    }
                    if ((this->drag & 0x12U) != 0) {
                      ysp = (qy - mysx) - mybx_bak;
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (2 < iVar2) {
                        ysp = (qy - mysx) + mybx_bak;
                      }
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (iVar2 < 3) {
                        this->dx = ysp + this->dx;
                        if ((this->drag & 0x10U) != 0) {
                          mybr = ysp + mybr;
                        }
                        mysx = ysp + mysx;
                        draw_h_arrow(mysx,(mybt + mysy) / 2,qy);
                      }
                      ysp = (qt - mysx) + mybx_bak;
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (2 < iVar2) {
                        ysp = (qt - mysx) - mybx_bak;
                      }
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (iVar2 < 3) {
                        this->dx = ysp + this->dx;
                        if ((this->drag & 0x10U) != 0) {
                          mybr = ysp + mybr;
                        }
                        mysx = ysp + mysx;
                        draw_h_arrow(mysx,(mybt + mysy) / 2,qt);
                      }
                    }
                  }
                  if ((mybr <= qt) && (qy <= mysx)) {
                    if ((this->drag & 0x18U) != 0) {
                      ysp = (ww_1 - mybt) - myby_bak;
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (2 < iVar2) {
                        ysp = (ww_1 - mybt) + myby_bak;
                      }
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (iVar2 < 3) {
                        this->dy = ysp + this->dy;
                        mybt = ysp + mybt;
                        if ((this->drag & 0x10U) != 0) {
                          mysy = ysp + mysy;
                        }
                        draw_v_arrow((mybr + mysx) / 2,mybt,ww_1);
                      }
                      ysp = (hh_1 - mybt) - myby_bak;
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (2 < iVar2) {
                        ysp = (hh_1 - mybt) + myby_bak;
                      }
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (iVar2 < 3) {
                        this->dy = ysp + this->dy;
                        mybt = ysp + mybt;
                        if ((this->drag & 0x10U) != 0) {
                          mysy = ysp + mysy;
                        }
                        draw_v_arrow((mybr + mysx) / 2,mybt,hh_1);
                      }
                    }
                    if ((this->drag & 0x14U) != 0) {
                      ysp = (ww_1 - mysy) - myby_bak;
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (2 < iVar2) {
                        ysp = (ww_1 - mysy) + myby_bak;
                      }
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (iVar2 < 3) {
                        this->dy = ysp + this->dy;
                        if ((this->drag & 0x10U) != 0) {
                          mybt = ysp + mybt;
                        }
                        mysy = ysp + mysy;
                        draw_v_arrow((mybr + mysx) / 2,mysy,ww_1);
                      }
                      ysp = (hh_1 - mysy) - myby_bak;
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (2 < iVar2) {
                        ysp = (hh_1 - mysy) + myby_bak;
                      }
                      iVar2 = ysp;
                      if (ysp < 1) {
                        iVar2 = -ysp;
                      }
                      if (iVar2 < 3) {
                        this->dy = ysp + this->dy;
                        if ((this->drag & 0x10U) != 0) {
                          mybt = ysp + mybt;
                        }
                        mysy = ysp + mysy;
                        draw_v_arrow((mybr + mysx) / 2,mysy,hh_1);
                      }
                    }
                  }
                }
              }
              qw = (Fl_Widget_Type *)(qw->super_Fl_Type).next;
            }
          }
          mysr = (mybr - mybr_bak) + mysr;
          selection._4_4_ = (mysx - local_98) + selection._4_4_;
          myst = (mybt - mybt_bak) + myst;
          selection._0_4_ = (mysy - mysel._4_4_) + (int)selection;
        }
        this->sx = mysr;
        this->sy = myst;
        this->sr = selection._4_4_;
        this->st = (int)selection;
        fl_line_style(2,0,(char *)0x0);
        fl_rect(mybr,mybt,mysx - mybr,mysy - mybt);
        fl_line_style(0,0,(char *)0x0);
        fl_rect(mysr,myst,selection._4_4_ - mysr,(int)selection - myst);
        fl_rectf(mysr,myst,5,5);
        fl_rectf(selection._4_4_ + -5,myst,5,5);
        fl_rectf(selection._4_4_ + -5,(int)selection + -5,5,5);
        fl_rectf(mysr,(int)selection + -5,5,5);
      }
    }
  }
  return;
}

Assistant:

void Fl_Window_Type::draw_overlay() {
  if (recalc) {
    bx = o->w(); by = o->h(); br = 0; bt = 0;
    numselected = 0;
    for (Fl_Type *q=next; q && q->level>level; q=q->next)
      if (q->selected && q->is_widget() && !q->is_menu_item()) {
	numselected++;
	Fl_Widget_Type* myo = (Fl_Widget_Type*)q;
	if (myo->o->x() < bx) bx = myo->o->x();
	if (myo->o->y() < by) by = myo->o->y();
	if (myo->o->x()+myo->o->w() > br) br = myo->o->x()+myo->o->w();
	if (myo->o->y()+myo->o->h() > bt) bt = myo->o->y()+myo->o->h();
      }
    recalc = 0;
    sx = bx; sy = by; sr = br; st = bt;
  }
  fl_color(FL_RED);
  if (drag==BOX && (x1 != mx || y1 != my)) {
    int x = x1; int r = mx; if (x > r) {x = mx; r = x1;}
    int y = y1; int b = my; if (y > b) {y = my; b = y1;}
    fl_rect(x,y,r-x,b-y);
  }
  if (overlays_invisible && !drag) return;
  if (selected) fl_rect(0,0,o->w(),o->h());
  if (!numselected) return;
  int mybx,myby,mybr,mybt;
  int mysx,mysy,mysr,myst;
  mybx = mysx = o->w(); myby = mysy = o->h(); mybr = mysr = 0; mybt = myst = 0;
  Fl_Type *selection = 0L; // used to store the one selected widget (if n==1)
  for (Fl_Type *q=next; q && q->level>level; q = q->next)
    if (q->selected && q->is_widget() && !q->is_menu_item()) {
      selection = q;
      Fl_Widget_Type* myo = (Fl_Widget_Type*)q;
      int x,y,r,t;
      newposition(myo,x,y,r,t);
      if (!show_guides || !drag || numselected != 1) fl_rect(x,y,r-x,t-y);
      if (x < mysx) mysx = x;
      if (y < mysy) mysy = y;
      if (r > mysr) mysr = r;
      if (t > myst) myst = t;
      if (!(myo->o->align() & FL_ALIGN_INSIDE)) {
        // Adjust left/right/top/bottom for top/bottom labels...
	int ww, hh;
	ww = (myo->o->align() & FL_ALIGN_WRAP) ? myo->o->w() : 0;
	hh = myo->o->labelsize();
	myo->o->measure_label(ww, hh);
	if (myo->o->align() & FL_ALIGN_TOP) y -= hh;
	else if (myo->o->align() & FL_ALIGN_BOTTOM) t += hh;
	else if (myo->o->align() & FL_ALIGN_LEFT) x -= ww + 4;
	else if (myo->o->align() & FL_ALIGN_RIGHT) r += ww + 4;
      }
      if (x < mybx) mybx = x;
      if (y < myby) myby = y;
      if (r > mybr) mybr = r;
      if (t > mybt) mybt = t;
    }
  if (selected) return;

  if (show_guides && drag) {
    // draw overlays for UI Guideline distances
    // - check for distance to the window edge
    //    * FLTK suggests 10 pixels from the edge
    int d;
    int xsp, ysp;
    int mybx_bak = mybx, myby_bak = myby, mybr_bak = mybr, mybt_bak = mybt;
    Fl_Widget_Type *mysel = (Fl_Widget_Type *)selection;


    ideal_spacing(xsp, ysp);

    if (drag) {
      // Check top spacing...
      if (abs(d = myby - ysp) < 3) {
	dy -= d;
	if (drag & DRAG) mybt -= d;
	myby -= d;
	draw_v_arrow(mybx+5, myby, 0);
      }

      // Check bottom spacing...
      if (abs(d = o->h() - mybt - ysp) < 3) {
	dy += d;
	if (drag & DRAG) myby += d;
	mybt += d;
	draw_v_arrow(mybx+5, mybt, o->h());
      }

      // Check left spacing...
      if (abs(d = mybx - xsp) < 3) {
        dx -= d;
	if (drag & DRAG) mybr -= d;
	mybx -= d;
	draw_h_arrow(mybx, myby+5, 0);
      }

      // Check right spacing...
      if (abs(d = o->w() - mybr - xsp) < 3) {
	dx += d;
	if (drag & DRAG) mybx += d;
	mybr += d;
	draw_h_arrow(mybr, myby+5, o->w());
      }
    }

    if (numselected==1 && selection && !(drag & DRAG)) {
      // Check ideal sizes
      int x,y,r,t;
      newposition(mysel,x,y,r,t);
      int w = r-x;
      int h = t-y;
      int iw = w, ih = h;

      mysel->ideal_size(iw, ih);

      if (drag & (TOP | BOTTOM)) {
	// Check height
	if (abs(d = ih - h) < 5) {
          // Resize height
	  if (drag & TOP) {
	    myby -= d;
	    y -= d;
	    dy -= d;
	  } else {
	    mybt += d;
	    t += d;
	    dy += d;
	  }
	}

	// Draw height guide
	draw_height(x < 50 ? x+10 : x-10, y, t,
	            x < 50 ? FL_ALIGN_RIGHT : FL_ALIGN_LEFT);
      }

      if (drag & (LEFT | RIGHT)) {
	// Check width
	if (abs(d = iw - w) < 5) {
          // Resize width
          if (drag & LEFT) {
	    mybx -= d;
	    x -= d;
	    dx -= d;
	  } else {
	    mybr += d;
	    r += d;
	    dx += d;
	  }
	}

	// Draw width guide
	draw_width(x, y < 50 ? y+10 : y-10, r,
	           y < 50 ? FL_ALIGN_BOTTOM : FL_ALIGN_TOP);
      }
    }

    // Check spacing and alignment between individual widgets
    if (drag && selection->is_widget()) {
      for (Fl_Type *q=next; q && q->level>level; q = q->next)
	if (q != selection && q->is_widget()) {
          Fl_Widget_Type *qw = (Fl_Widget_Type*)q;
          // Only check visible widgets...
	  if (!qw->o->visible_r()) continue;

          // Get bounding box of widget...
	  int qx = qw->o->x();
	  int qr = qw->o->x() + qw->o->w();
	  int qy = qw->o->y();
	  int qt = qw->o->y() + qw->o->h();

	  if (!(qw->o->align() & FL_ALIGN_INSIDE)) {
            // Adjust top/bottom for top/bottom labels...
	    int ww, hh;
	    ww = qw->o->w();
	    hh = qw->o->labelsize();
	    qw->o->measure_label(ww, hh);
	    if (qw->o->align() & FL_ALIGN_TOP) qy -= hh;
	    if (qw->o->align() & FL_ALIGN_BOTTOM) qt += hh;
	  }

          // Do horizontal alignment when the widget is within 25
	  // pixels vertically...
	  if (fl_min(abs(qy - mysel->o->y() - mysel->o->h()),
	             abs(mysel->o->y() - qt)) < 25) {
            // Align to left of other widget...
            if ((drag & (LEFT | DRAG)) && abs(d = mybx - qx) < 3) {
	      dx += d;
              mybx += d;
	      if (drag & DRAG) mybr += d;

	      draw_left_brace(qw->o);
	    }

            // Align to right of other widget...
            if ((drag & (RIGHT | DRAG)) &&
	        abs(d = qr - mybr) < 3) {
	      dx += d;
              if (drag & DRAG) mybx += d;
	      mybr += d;

	      draw_right_brace(qw->o);
	    }
          }

          // Align to top of other widget...
          if ((drag & (TOP | DRAG)) && abs(d = myby - qy) < 3) {
	    dy += d;
            myby += d;
	    if (drag & DRAG) mybt += d;

	    draw_top_brace(qw->o);
	  }

          // Align to bottom of other widget...
          if ((drag & (BOTTOM | DRAG)) && abs(d = qt - mybt) < 3) {
	    dy += d;
            if (drag & DRAG) myby += d;
	    mybt += d;

	    draw_bottom_brace(qw->o);
	  }

          // Check spacing between widgets
	  if (mysel->is_group()) mysel->ideal_spacing(xsp, ysp);
          else qw->ideal_spacing(xsp, ysp);

          if ((qt)>=myby && qy<=mybt) {
            if (drag & (LEFT | DRAG)) {
	      // Compare left of selected to left of current
	      if (abs(d = qx - mybx - xsp) >= 3)
	        d = qx - mybx + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	mybx += d;
		if (drag & DRAG) mybr += d;

        	// Draw left arrow
		draw_h_arrow(mybx, (myby+mybt)/2, qx);
              }

	      // Compare left of selected to right of current
              if (abs(d = qr - mybx - xsp) >= 3)
	        d = qr - mybx + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	mybx += d;
		if (drag & DRAG) mybr += d;

        	// Draw left arrow
		draw_h_arrow(mybx, (myby+mybt)/2, qr);
              }
	    }

            if (drag & (RIGHT | DRAG)) {
	      // Compare right of selected to left of current
	      if (abs(d = qx - mybr - xsp) >= 3)
	        d = qx - mybr + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	if (drag & DRAG) mybx += d;
		mybr += d;

        	// Draw right arrow
		draw_h_arrow(mybr, (myby+mybt)/2, qx);
              }

	      // Compare right of selected to right of current
              if (abs(d = qr - mybr + xsp) >= 3)
	        d = qr - mybr - xsp;

              if (abs(d) < 3) {
		dx += d;
        	if (drag & DRAG) mybx += d;
		mybr += d;

        	// Draw right arrow
		draw_h_arrow(mybr, (myby+mybt)/2, qr);
              }
            }
	  }

          if (qr>=mybx && qx<=mybr) {
            // Compare top of selected to top of current
            if (drag & (TOP | DRAG)) {
	      if (abs(d = qy - myby - ysp) >= 3)
	        d = qy - myby + ysp;

	      if (abs(d) < 3) {
		dy += d;
		myby += d;
		if (drag & DRAG) mybt += d;

		// Draw up arrow...
		draw_v_arrow((mybx+mybr)/2, myby, qy);
              }

              // Compare top of selected to bottom of current
              if (abs(d = qt - myby - ysp) >= 3)
                d = qt - myby + ysp;

              if (abs(d) < 3) {
		dy += d;
		myby += d;
		if (drag & DRAG) mybt += d;

		// Draw up arrow...
		draw_v_arrow((mybx+mybr)/2, myby, qt);
              }
	    }

	    // Compare bottom of selected to top of current
            if (drag & (BOTTOM | DRAG)) {
	      if (abs(d = qy - mybt - ysp) >= 3)
	        d = qy - mybt + ysp;

	      if (abs(d) < 3) {
		dy += d;
		if (drag & DRAG) myby += d;
		mybt += d;

		// Draw down arrow...
		draw_v_arrow((mybx+mybr)/2, mybt, qy);
              }

	      // Compare bottom of selected to bottom of current
              if (abs(d = qt - mybt - ysp) >= 3)
                d = qt - mybt + ysp;

              if (abs(d) < 3) {
		dy += d;
		if (drag & DRAG) myby += d;
		mybt += d;

		// Draw down arrow...
		draw_v_arrow((mybx+mybr)/2, mybt, qt);
              }
	    }
          }
	}
    }
    mysx += mybx-mybx_bak; mysr += mybr-mybr_bak;
    mysy += myby-myby_bak; myst += mybt-mybt_bak;
  }
  // align the snapping selection box with the box we draw.
  sx = mysx; sy = mysy; sr = mysr; st = myst;

  // Draw selection box + resize handles...
  // draw box including all labels
  fl_line_style(FL_DOT);
  fl_rect(mybx,myby,mybr-mybx,mybt-myby);
  fl_line_style(FL_SOLID);
  // draw box excluding labels
  fl_rect(mysx,mysy,mysr-mysx,myst-mysy);
  fl_rectf(mysx,mysy,5,5);
  fl_rectf(mysr-5,mysy,5,5);
  fl_rectf(mysr-5,myst-5,5,5);
  fl_rectf(mysx,myst-5,5,5);
}